

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O3

void cali::write_report_for_query(cali_id_t chn_id,char *query,int flush_opts,ostream *os)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  CalQLParser parser;
  OutputStream stream;
  QueryProcessor queryP;
  Channel channel;
  Caliper c;
  QuerySpec spec;
  CalQLParser CStack_2b8;
  string local_2b0;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  SnapshotFlushFn local_270;
  Caliper local_250;
  undefined1 local_230 [8];
  vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_> local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_> local_1b0;
  vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_> local_188 [3];
  undefined1 local_140 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
  local_b0 [5];
  anon_union_8_7_33918203_for_value local_30;
  
  Caliper::Caliper(&local_250);
  Caliper::get_channel((Caliper *)local_280,(cali_id_t)&local_250);
  if (((GlobalData *)local_280._8_8_ == (GlobalData *)0x0) ||
     (*(_Atomic_word *)(local_280._8_8_ + 8) < 1)) {
    poVar3 = (ostream *)local_230;
    std::ofstream::ofstream(poVar3);
    local_30.v_type = CALI_TYPE_INV;
    iVar2 = Log::verbosity();
    if (local_30._0_4_ <= iVar2) {
      poVar3 = Log::get_stream((Log *)local_230);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"write_report_for_query(): invalid channel id ",0x2d);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    local_230 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT - 0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base((ios_base *)(local_140 + 8));
  }
  else {
    CalQLParser::CalQLParser(&CStack_2b8,query);
    bVar1 = CalQLParser::error(&CStack_2b8);
    if (bVar1) {
      poVar3 = (ostream *)local_230;
      std::ofstream::ofstream(poVar3);
      local_30.v_type = CALI_TYPE_INV;
      iVar2 = Log::verbosity();
      if (local_30._0_4_ <= iVar2) {
        poVar3 = Log::get_stream((Log *)local_230);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"write_report_for_query(): query parse error: ",0x2d);
      CalQLParser::error_msg_abi_cxx11_(&local_2b0,&CStack_2b8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT - 0x18)) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base((ios_base *)(local_140 + 8));
    }
    else {
      CalQLParser::spec((QuerySpec *)local_230,&CStack_2b8);
      OutputStream::OutputStream((OutputStream *)&local_2b0);
      OutputStream::set_stream((OutputStream *)&local_2b0,os);
      QueryProcessor::QueryProcessor
                ((QueryProcessor *)local_290,(QuerySpec *)local_230,(OutputStream *)&local_2b0);
      local_270.super__Function_base._M_functor._8_8_ = (Node *)0x0;
      local_270._M_invoker =
           std::
           _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/cali.cpp:822:45)>
           ::_M_invoke;
      local_270.super__Function_base._M_manager =
           std::
           _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/cali.cpp:822:45)>
           ::_M_manager;
      local_270.super__Function_base._M_functor._M_unused._M_object = (ThreadData *)local_290;
      Caliper::flush(&local_250,(ChannelBody *)local_280._0_8_,(SnapshotView)ZEXT816(0),&local_270);
      if (local_270.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_270.super__Function_base._M_manager)
                  ((_Any_data *)&local_270,(_Any_data *)&local_270,__destroy_functor);
      }
      QueryProcessor::flush
                ((QueryProcessor *)local_290,&local_250.super_CaliperMetadataAccessInterface);
      QueryProcessor::~QueryProcessor((QueryProcessor *)local_290);
      OutputStream::~OutputStream((OutputStream *)&local_2b0);
      std::vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
      ::~vector(local_b0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_e0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_110);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_140);
      std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::~vector
                (local_188);
      std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::~vector
                (&local_1b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_200);
      std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
      ~vector(&local_228);
    }
    CalQLParser::~CalQLParser(&CStack_2b8);
  }
  Channel::~Channel((Channel *)local_280);
  return;
}

Assistant:

void write_report_for_query(cali_id_t chn_id, const char* query, int flush_opts, std::ostream& os)
{
    Caliper c;
    Channel channel = c.get_channel(chn_id);

    if (!channel) {
        Log(0).stream() << "write_report_for_query(): invalid channel id " << chn_id << std::endl;

        return;
    }

    CalQLParser parser(query);

    if (parser.error()) {
        Log(0).stream() << "write_report_for_query(): query parse error: " << parser.error_msg() << std::endl;

        return;
    }

    QuerySpec    spec(parser.spec());
    OutputStream stream;

    stream.set_stream(&os);

    QueryProcessor queryP(spec, stream);

    c.flush(channel.body(), SnapshotView(), [&queryP](CaliperMetadataAccessInterface& db, const std::vector<Entry>& rec) {
        queryP.process_record(db, rec);
    });

    queryP.flush(c);
}